

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O1

opdef * addop(opdef *cur,char *nam,opctxdef *opctx)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  size_t sVar5;
  size_t sVar6;
  opdef *poVar7;
  char *result_buf;
  osdirhdl_t dirhdl;
  unsigned_long fmode_1;
  unsigned_long fmode;
  unsigned_long fattr_1;
  unsigned_long fattr;
  char dir_prefix [4096];
  char fname [4096];
  char resname [4096];
  char fullname [4096];
  osdirhdl_t local_5060;
  undefined8 local_5058;
  undefined8 local_5050;
  byte local_5048 [8];
  unsigned_long local_5040;
  char local_5038 [4096];
  char local_4038 [4096];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  if (opctx->doing_type != 0) {
    iVar2 = stricmp(nam,"xfcn");
    if (iVar2 == 0) {
      iVar2 = 1;
    }
    else {
      iVar2 = stricmp(nam,"html");
      if (iVar2 == 0) {
        iVar2 = 2;
      }
      else {
        iVar2 = 0;
        printf("invalid resource type specified: %s",nam);
        putchar(10);
        os_term(1);
      }
    }
    opctx->restype = iVar2;
    opctx->doing_type = 0;
    return cur;
  }
  if (*nam == '-') {
    iVar2 = stricmp(nam,"-type");
    if (iVar2 == 0) {
      opctx->doing_type = 1;
      return cur;
    }
    iVar2 = stricmp(nam,"-replace");
    if (iVar2 == 0) {
      opctx->flag = 3;
      return cur;
    }
    iVar2 = stricmp(nam,"-delete");
    if (iVar2 == 0) {
      opctx->flag = 2;
      return cur;
    }
    iVar2 = stricmp(nam,"-add");
    if (iVar2 != 0) {
      printf("invalid option: %s",nam);
      putchar(10);
      os_term(1);
      return cur;
    }
    opctx->flag = 1;
    return cur;
  }
  for (pcVar3 = nam + 1; pcVar3[-1] != '\0'; pcVar3 = pcVar3 + 1) {
    if (pcVar3[-1] == '=') {
      pcVar3[-1] = '\0';
      goto LAB_00106320;
    }
  }
  result_buf = local_2038;
  os_cvt_dir_url(result_buf,0x1000,nam);
  goto LAB_0010635a;
  while( true ) {
    ppuVar4 = __ctype_b_loc();
    pcVar3 = result_buf + 1;
    if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
LAB_00106320:
    result_buf = pcVar3;
    cVar1 = *result_buf;
    if ((long)cVar1 < 0) break;
  }
LAB_0010635a:
  iVar2 = osfmode(nam,1,&local_5050,&local_5040);
  if ((iVar2 == 0) || ((local_5050._1_1_ & 0x40) == 0)) {
    sVar5 = strlen(result_buf);
    sVar6 = strlen(nam);
    poVar7 = (opdef *)malloc(sVar5 + sVar6 + 0x22);
    poVar7->opnxt = cur;
    poVar7->opflag = opctx->flag;
    poVar7->opres = (char *)(poVar7 + 1);
    iVar2 = get_file_restype(opctx->restype,nam);
    poVar7->oprestype = iVar2;
    strcpy(poVar7->opres,result_buf);
    pcVar3 = poVar7->opres;
    sVar5 = strlen(pcVar3);
    pcVar3 = pcVar3 + sVar5 + 1;
    poVar7->opfile = pcVar3;
    strcpy(pcVar3,nam);
    cur = poVar7;
  }
  else {
    os_cvt_dir_url(local_5038,0xfff,nam);
    if (local_5038[0] != '\0') {
      sVar5 = strlen(local_5038);
      (local_5038 + sVar5)[0] = '/';
      (local_5038 + sVar5)[1] = '\0';
    }
    iVar2 = os_open_dir(nam,&local_5060);
    if (iVar2 != 0) {
      iVar2 = os_read_dir(local_5060,local_3038,0x1000);
      if (iVar2 != 0) {
        poVar7 = cur;
        do {
          os_build_full_path(local_1038,0x1000,nam,local_3038);
          iVar2 = osfmode(local_1038,1,&local_5058,(unsigned_long *)local_5048);
          cur = poVar7;
          if (((iVar2 != 0) && ((local_5058._1_1_ & 0x40) == 0)) && ((local_5048[0] & 3) == 0)) {
            sprintf(local_4038,"%s%s",local_5038,local_3038);
            sVar5 = strlen(local_4038);
            sVar6 = strlen(local_1038);
            cur = (opdef *)malloc(sVar5 + sVar6 + 0x22);
            cur->opnxt = poVar7;
            cur->opflag = opctx->flag;
            iVar2 = get_file_restype(opctx->restype,local_3038);
            cur->oprestype = iVar2;
            poVar7 = cur + 1;
            cur->opres = (char *)poVar7;
            strcpy((char *)poVar7,local_4038);
            sVar5 = strlen((char *)poVar7);
            pcVar3 = (char *)((long)&cur[1].opnxt + sVar5 + 1);
            cur->opfile = pcVar3;
            strcpy(pcVar3,local_1038);
          }
          iVar2 = os_read_dir(local_5060,local_3038,0x1000);
          poVar7 = cur;
        } while (iVar2 != 0);
      }
      os_close_dir(local_5060);
    }
  }
  return cur;
}

Assistant:

static opdef *addop(opdef *cur, char *nam, opctxdef *opctx)
{
    char  *p;
    opdef *newop;
    char   resname[OSFNMAX];
    unsigned long fmode;
    unsigned long fattr;

    /* see if we're parsing a -type argument */
    if (opctx->doing_type)
    {
        /* 
         *   parse the type name, and store it as the type for following
         *   resources
         */
        opctx->restype = parse_res_type(nam);
        
        /* we're done parsing the -type argument */
        opctx->doing_type = FALSE;

        /* 
         *   we're done parsing this argument - we haven't added any
         *   operations, so return old list head 
         */
        return cur;
    }

    /* see if we have an option */
    if (*nam == '-')
    {
        /* see what we have */
        if (!stricmp(nam, "-type"))
        {
            /* 
             *   note that we're doing a type, so we parse it on the next
             *   argument 
             */
            opctx->doing_type = TRUE;
        }
        else if (!stricmp(nam, "-replace"))
        {
            /* set current flags to replace */
            opctx->flag = OPFADD | OPFDEL;
        }
        else if (!stricmp(nam, "-delete"))
        {
            /* set current flags to delete */
            opctx->flag = OPFDEL;
        }
        else if (!stricmp(nam, "-add"))
        {
            /* set current flags to add */
            opctx->flag = OPFADD;
        }
        else
        {
            /* invalid argument */
            rscptf("invalid option: %s", nam);
            errexit("", 1);
        }

        /* 
         *   done parsing this option - we didn't add a new operation, so
         *   return the current list head 
         */
        return cur;
    }

    /* look for '=' */
    for (p = nam ; *p && *p != '=' ; ++p);
    if (*p == '=')
    {
        /* 
         *   We found an '=', so an explicit resource name follows - use
         *   the given string as the resource name rather than basing the
         *   resource name on the filename.  First, overwrite the '=' with
         *   a null byte so that the filename string is terminated.  
         */
        *p = '\0';

        /* skip the '=' (now the null byte, of course) */
        ++p;

        /* 
         *   skip any spaces after the '='; leave p pointing to the start
         *   of the resource name 
         */
        while (t_isspace(*p))
            ++p;
    }
    else
    {
        /* 
         *   A resource name wasn't specified - synthesize a resource name
         *   based on the filename by converting from the local file system
         *   name to a relative URL 
         */
        os_cvt_dir_url(resname, sizeof(resname), nam);

        /* point p to the synthesized resource name */
        p = resname;
    }
    
    /*
     *   If we're adding a directory, rather than returning a single op
     *   for the directory, expand the directory into ops for for all of
     *   the files in the directory. 
     */
    if (osfmode(nam, TRUE, &fmode, &fattr)
        && (fmode & OSFMODE_DIR) != 0)
        return addopdir(cur, nam, opctx);
    
    /* allocate space and set up new op */
    newop = (opdef *)malloc(sizeof(opdef) + strlen(p) + strlen(nam) + 2);

    newop->opnxt  = cur;
    newop->opflag = opctx->flag;
    newop->opres  = (char *)(newop + 1);
    newop->oprestype = get_file_restype(opctx->restype, nam);
    strcpy(newop->opres, p);
    newop->opfile = newop->opres + strlen(newop->opres) + 1;
    strcpy(newop->opfile, nam);

    return(newop);
}